

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

int EVP_HPKE_CTX_setup_auth_sender_with_seed_for_testing
              (EVP_HPKE_CTX *ctx,uint8_t *out_enc,size_t *out_enc_len,size_t max_enc,
              EVP_HPKE_KEY *key,EVP_HPKE_KDF *kdf,EVP_HPKE_AEAD *aead,uint8_t *peer_public_key,
              size_t peer_public_key_len,uint8_t *info,size_t info_len,uint8_t *seed,size_t seed_len
              )

{
  EVP_HPKE_KEM *pEVar1;
  int iVar2;
  size_t shared_secret_len;
  uint8_t shared_secret [32];
  
  if (key->kem->auth_encap_with_seed ==
      (_func_int_EVP_HPKE_KEY_ptr_uint8_t_ptr_size_t_ptr_uint8_t_ptr_size_t_ptr_size_t_uint8_t_ptr_size_t_uint8_t_ptr_size_t
       *)0x0) {
    ERR_put_error(6,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x3b4);
  }
  else {
    EVP_HPKE_CTX_zero(ctx);
    ctx->is_sender = 1;
    pEVar1 = key->kem;
    ctx->kem = pEVar1;
    ctx->kdf = kdf;
    ctx->aead = aead;
    iVar2 = (*pEVar1->auth_encap_with_seed)
                      (key,shared_secret,&shared_secret_len,out_enc,out_enc_len,max_enc,
                       peer_public_key,peer_public_key_len,seed,seed_len);
    if ((iVar2 != 0) &&
       (iVar2 = hpke_key_schedule(ctx,'\x02',shared_secret,shared_secret_len,info,info_len),
       iVar2 != 0)) {
      return 1;
    }
    EVP_AEAD_CTX_cleanup(&ctx->aead_ctx);
  }
  return 0;
}

Assistant:

int EVP_HPKE_CTX_setup_auth_sender_with_seed_for_testing(
    EVP_HPKE_CTX *ctx, uint8_t *out_enc, size_t *out_enc_len, size_t max_enc,
    const EVP_HPKE_KEY *key, const EVP_HPKE_KDF *kdf, const EVP_HPKE_AEAD *aead,
    const uint8_t *peer_public_key, size_t peer_public_key_len,
    const uint8_t *info, size_t info_len, const uint8_t *seed,
    size_t seed_len) {
  if (key->kem->auth_encap_with_seed == NULL) {
    // Not all HPKE KEMs support AuthEncap.
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }

  EVP_HPKE_CTX_zero(ctx);
  ctx->is_sender = 1;
  ctx->kem = key->kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  uint8_t shared_secret[MAX_SHARED_SECRET_LEN];
  size_t shared_secret_len;
  if (!key->kem->auth_encap_with_seed(
          key, shared_secret, &shared_secret_len, out_enc, out_enc_len, max_enc,
          peer_public_key, peer_public_key_len, seed, seed_len) ||
      !hpke_key_schedule(ctx, HPKE_MODE_AUTH, shared_secret, shared_secret_len,
                         info, info_len)) {
    EVP_HPKE_CTX_cleanup(ctx);
    return 0;
  }
  return 1;
}